

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# stb_image_aug.c
# Opt level: O2

float * ldr_to_hdr(stbi_uc *data,int x,int y,int comp)

{
  float *pfVar1;
  long lVar2;
  ulong uVar3;
  uint uVar4;
  ulong uVar5;
  long lVar6;
  stbi_uc *psVar7;
  uint uVar8;
  ulong uVar9;
  float *pfVar10;
  ulong uVar11;
  double dVar12;
  
  uVar4 = x * y;
  pfVar1 = (float *)malloc((long)(int)(uVar4 * comp) << 2);
  if (pfVar1 == (float *)0x0) {
    free(data);
    failure_reason = "Out of memory";
  }
  else {
    uVar8 = (comp + (comp & 1U)) - 1;
    uVar11 = 0;
    uVar9 = (ulong)uVar8;
    if ((int)uVar8 < 1) {
      uVar9 = uVar11;
    }
    lVar2 = (long)comp;
    psVar7 = data;
    pfVar10 = pfVar1;
    uVar5 = (ulong)uVar4;
    if ((int)uVar4 < 1) {
      uVar5 = uVar11;
    }
    for (; uVar11 != uVar5; uVar11 = uVar11 + 1) {
      for (uVar3 = 0; uVar9 != uVar3; uVar3 = uVar3 + 1) {
        dVar12 = pow((double)((float)psVar7[uVar3] / 255.0),(double)l2h_gamma);
        pfVar10[uVar3] = (float)dVar12 * l2h_scale;
      }
      if ((int)uVar9 < comp) {
        lVar6 = uVar11 * lVar2 + uVar9;
        pfVar1[lVar6] = (float)data[lVar6] / 255.0;
      }
      psVar7 = psVar7 + lVar2;
      pfVar10 = pfVar10 + lVar2;
    }
    free(data);
  }
  return pfVar1;
}

Assistant:

static float   *ldr_to_hdr(stbi_uc *data, int x, int y, int comp)
{
   int i,k,n;
   float *output = (float *) malloc(x * y * comp * sizeof(float));
   if (output == NULL) { free(data); return epf("outofmem", "Out of memory"); }
   // compute number of non-alpha components
   if (comp & 1) n = comp; else n = comp-1;
   for (i=0; i < x*y; ++i) {
      for (k=0; k < n; ++k) {
         output[i*comp + k] = (float) pow(data[i*comp+k]/255.0f, l2h_gamma) * l2h_scale;
      }
      if (k < comp) output[i*comp + k] = data[i*comp+k]/255.0f;
   }
   free(data);
   return output;
}